

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

bool __thiscall Tokenizer::tryToSkipSpaces(Tokenizer *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  
  cVar1 = Stream::peek(&this->stream_);
  iVar2 = isspace((int)cVar1);
  iVar3 = iVar2;
  while (iVar3 != 0) {
    Stream::advance(&this->stream_);
    cVar1 = Stream::peek(&this->stream_);
    iVar3 = isspace((int)cVar1);
  }
  return iVar2 != 0;
}

Assistant:

bool Tokenizer::tryToSkipSpaces()
{
  bool result = false;
  while(isspace(stream_.peek()))
  {
    result = true;
    stream_.advance();
  }

  return result;
}